

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# control_stack.c
# Opt level: O2

control_frame * pop_control_stack(control_frame *__return_storage_ptr__,control_stack *s)

{
  undefined7 uVar1;
  long lVar2;
  control_frame *pcVar3;
  control_frame *pcVar4;
  
  pcVar3 = s->sp + -1;
  s->sp = pcVar3;
  s->size = s->size - 1;
  if (s->bp <= pcVar3) {
    pcVar4 = __return_storage_ptr__;
    for (lVar2 = 9; lVar2 != 0; lVar2 = lVar2 + -1) {
      uVar1 = *(undefined7 *)&pcVar3->field_0x1;
      pcVar4->opcode = pcVar3->opcode;
      *(undefined7 *)&pcVar4->field_0x1 = uVar1;
      pcVar3 = (control_frame *)&pcVar3->instructions;
      pcVar4 = (control_frame *)&pcVar4->instructions;
    }
    return __return_storage_ptr__;
  }
  fwrite("control_stack overflow\n",0x17,1,_stderr);
  __assert_fail("0",
                "/workspace/llm4binary/github/license_all_cmakelists_1510/Kingdo777[P]WCasm/tool/stack/control_stack.c"
                ,0x3c,"control_frame pop_control_stack(control_stack *)");
}

Assistant:

control_frame pop_control_stack(control_stack *s) {
    s->sp -= 1;
    s->size--;
    if (s->sp < s->bp) {
        errorExit("control_stack overflow\n");
    } else {
        return *s->sp;
    }
}